

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::ContactForceLoadQ
          (ChBody *this,ChVector<double> *F,ChVector<double> *point,ChState *state_x,
          ChVectorDynamic<> *Q,int offset)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  char *__function;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChVector<double> result;
  ChVector<double> point_loc;
  ChVector<double> force_loc;
  ChCoordsys<double> csys;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  double *local_b8;
  double local_b0;
  undefined8 uStack_a8;
  ChState *local_a0;
  undefined8 local_98;
  long local_88;
  double local_80;
  double local_78;
  double dStack_70;
  ChCoordsys<double> local_68;
  
  local_b8 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_88 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_b0 = 3.45845952088873e-323;
  local_98 = 0;
  local_a0 = state_x;
  if (local_88 < 7) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
    goto LAB_005099a1;
  }
  ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_68,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&local_b8,(type *)0x0);
  ChCoordsys<double>::TransformPointParentToLocal(&local_68,point);
  ChCoordsys<double>::TransformDirectionParentToLocal(&local_68,F);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_b8;
  auVar13._8_8_ = uStack_a8;
  auVar13._0_8_ = uStack_a8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_80;
  auVar15._8_8_ = dStack_70;
  auVar15._0_8_ = dStack_70;
  auVar4._8_8_ = uStack_a8;
  auVar4._0_8_ = local_b0;
  auVar5._8_8_ = dStack_70;
  auVar5._0_8_ = local_78;
  auVar11 = vunpcklpd_avx(auVar13,auVar12);
  auVar10 = vunpcklpd_avx(auVar15,auVar10);
  auVar14._0_8_ = local_78 * auVar11._0_8_;
  auVar14._8_8_ = dStack_70 * auVar11._8_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_80 * local_b0;
  auVar11 = vfmsub231sd_fma(auVar11,auVar12,auVar5);
  local_d8 = vfmsub213pd_fma(auVar10,auVar4,auVar14);
  local_c8 = auVar11._0_8_;
  if (-1 < offset) {
    lVar6 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3;
    if (offset <= lVar6) {
      pdVar3 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar7 = 3;
      pdVar2 = pdVar3 + offset;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_005098cc;
      }
      else {
LAB_005098cc:
        uVar9 = 0;
        do {
          pdVar2[uVar9] = F->m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      if (uVar7 < 3) {
        do {
          pdVar2[uVar7] = F->m_data[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      lVar1 = (ulong)(uint)offset + 3;
      if (lVar1 <= lVar6) {
        pdVar2 = pdVar3 + (ulong)(uint)offset + 3;
        uVar7 = 3;
        if (((ulong)pdVar2 & 7) == 0) {
          uVar8 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar8 < 3) {
            uVar7 = (ulong)uVar8;
          }
          if (uVar8 == 0) goto LAB_0050993d;
        }
        memcpy(pdVar2,local_d8,(ulong)(uint)((int)uVar7 * 8));
LAB_0050993d:
        if ((uint)uVar7 < 3) {
          uVar9 = (ulong)((uint)uVar7 * 8);
          memcpy(pdVar3 + lVar1 + uVar7,local_d8 + uVar9,0x18 - uVar9);
        }
        return;
      }
    }
  }
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_005099a1:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChBody::ContactForceLoadQ(const ChVector<>& F,
                               const ChVector<>& point,
                               const ChState& state_x,
                               ChVectorDynamic<>& Q,
                               int offset) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> point_loc = csys.TransformPointParentToLocal(point);
    ChVector<> force_loc = csys.TransformDirectionParentToLocal(F);
    ChVector<> torque_loc = Vcross(point_loc, force_loc);
    Q.segment(offset + 0, 3) = F.eigen();
    Q.segment(offset + 3, 3) = torque_loc.eigen();
}